

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

optional<helics::MessageProcessingResult> __thiscall
helics::FederateState::checkProcResult
          (FederateState *this,
          tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *proc_result,
          ActionMessage *cmd)

{
  string *this_00;
  FederateStates FVar1;
  uint uVar2;
  size_type sVar3;
  TimeCoordinator *pTVar4;
  long lVar5;
  uint __val;
  _Alloc_hider _Var6;
  uint uVar7;
  FederateStates FVar8;
  MessageProcessingResult MVar9;
  int iVar11;
  char *__s;
  size_t __len2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  ushort uVar13;
  uint uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  size_type sVar17;
  char *in_R9;
  uint __len;
  string_view logMessageSource;
  string_view logMessageSource_00;
  string_view fmt;
  string_view logMessageSource_01;
  string_view fmt_00;
  string_view logMessageSource_02;
  string_view message;
  string_view message_00;
  format_args args;
  string_view message_01;
  format_args args_00;
  string_view message_02;
  int in_stack_ffffffffffffff7c;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  ushort uVar10;
  
  this->timeGranted_mode =
       (proc_result->
       super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
       super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.super__Tuple_impl<2UL,_bool>.
       super__Head_base<2UL,_bool,_false>._M_head_impl;
  FVar1 = (proc_result->
          super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
          super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl;
  if ((this->state)._M_i == FVar1) goto switchD_002ca304_caseD_3;
  if ((this->state)._M_i == FVar1) goto switchD_002ca2d3_default;
  switch(FVar1) {
  case CREATED:
  case TERMINATING:
  case ERRORED:
  case FINISHED:
    LOCK();
    (this->state)._M_i = FVar1;
    UNLOCK();
    break;
  case INITIALIZING:
    FVar8 = CREATED;
    goto LAB_002ca2e1;
  case EXECUTING:
    FVar8 = INITIALIZING;
LAB_002ca2e1:
    LOCK();
    if (FVar8 == (this->state)._M_i) {
      (this->state)._M_i = FVar1;
    }
    UNLOCK();
  }
switchD_002ca2d3_default:
  switch((proc_result->
         super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
         super__Head_base<0UL,_helics::FederateStates,_false>._M_head_impl) {
  case INITIALIZING:
    if (0xe < this->maxLogLevel) {
      logMessageSource._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      logMessageSource._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      message._M_str = "Granting Initialization";
      message._M_len = 0x17;
      in_R9 = "Granting Initialization";
      logMessage(this,0xf,logMessageSource,message,false);
    }
    iVar11 = checkInterfaces(this);
    if (iVar11 != 0) {
      uVar13 = 0x100;
      uVar10 = 7;
      if ((this->state)._M_i != ERRORED) {
        LOCK();
        (this->state)._M_i = ERRORED;
        UNLOCK();
      }
      goto LAB_002ca812;
    }
    TimeCoordinator::enterInitialization
              ((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
    break;
  case EXECUTING:
    (**(code **)((long)(((this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                       super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x10))();
    if (0xe < this->maxLogLevel) {
      in_R9 = "Granting Execution";
      sVar17 = 0x12;
LAB_002ca40a:
      iVar11 = 0xf;
      goto LAB_002ca5ed;
    }
    break;
  case ERRORED:
    sVar3 = (cmd->payload).bufferSize;
    if (sVar3 == 0) {
      __s = commandErrorString(in_stack_ffffffffffffff7c);
      this_00 = &this->errorString;
      sVar3 = (this->errorString)._M_string_length;
      __len2 = strlen(__s);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,0,
                 sVar3,__s,__len2);
      iVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00,"unknown");
      if (iVar11 == 0) {
        uVar2 = cmd->messageID;
        __val = -uVar2;
        if (0 < (int)uVar2) {
          __val = uVar2;
        }
        __len = 1;
        if (9 < __val) {
          uVar16 = (ulong)__val;
          uVar7 = 4;
          do {
            __len = uVar7;
            uVar14 = (uint)uVar16;
            if (uVar14 < 100) {
              __len = __len - 2;
              goto LAB_002ca4d7;
            }
            if (uVar14 < 1000) {
              __len = __len - 1;
              goto LAB_002ca4d7;
            }
            if (uVar14 < 10000) goto LAB_002ca4d7;
            uVar16 = uVar16 / 10000;
            uVar7 = __len + 4;
          } while (99999 < uVar14);
          __len = __len + 1;
        }
LAB_002ca4d7:
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_58,(ulong)(-((int)uVar2 >> 0x1f) + __len),'-');
        CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_58._M_dataplus._M_p + (uint)-((int)uVar2 >> 0x1f),__len,__val);
        pbVar12 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                            (&local_58,0,0," code:",6);
        local_78._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
        paVar15 = &pbVar12->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == paVar15) {
          local_78.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        }
        else {
          local_78.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        }
        local_78._M_string_length = pbVar12->_M_string_length;
        (pbVar12->_M_dataplus)._M_p = (pointer)paVar15;
        pbVar12->_M_string_length = 0;
        (pbVar12->field_2)._M_local_buf[0] = '\0';
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(local_38,local_78._M_dataplus._M_p,local_78._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->errorString,0,(this->errorString)._M_string_length,
                 (char *)(cmd->payload).heap,sVar3);
    }
    this->errorCode = cmd->messageID;
    in_R9 = (this->errorString)._M_dataplus._M_p;
    sVar17 = (this->errorString)._M_string_length;
    iVar11 = 0;
LAB_002ca5ed:
    logMessageSource_00._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    logMessageSource_00._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    message_00._M_str = in_R9;
    message_00._M_len = sVar17;
    logMessage(this,iVar11,logMessageSource_00,message_00,false);
    break;
  case FINISHED:
    if (0xe < this->maxLogLevel) {
      in_R9 = "Terminating";
      sVar17 = 0xb;
      goto LAB_002ca40a;
    }
  }
switchD_002ca304_caseD_3:
  MVar9 = (proc_result->
          super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
          super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
          super__Head_base<1UL,_helics::MessageProcessingResult,_false>._M_head_impl;
  uVar10 = (ushort)(byte)MVar9;
  if (MVar9 == DELAY_MESSAGE) {
    addFederateToDelay(this,(GlobalFederateId)(cmd->source_id).gid);
    uVar13 = 0x100;
    uVar10 = 0xff;
    goto LAB_002ca812;
  }
  if (MVar9 == CONTINUE_PROCESSING) {
    uVar13 = 0;
    goto LAB_002ca812;
  }
  if (MVar9 == REPROCESS_MESSAGE) {
    if ((cmd->dest_id).gid != (this->global_id)._M_i.gid) {
      routeMessage(this,cmd);
      uVar13 = 0x100;
      uVar10 = 0xfe;
      goto LAB_002ca812;
    }
    MVar9 = processActionMessage(this,cmd);
  }
  else {
    if (this->timeGranted_mode == true) {
      pTVar4 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      lVar5 = (pTVar4->time_granted).internalTimeCode;
      (this->time_granted).internalTimeCode = lVar5;
      (this->allowed_send_time).internalTimeCode =
           (pTVar4->info).outputDelay.internalTimeCode + (pTVar4->time_granted).internalTimeCode;
      sVar17 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var6 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (cmd->messageAction == cmd_force_time_grant) {
        if (this->ignore_time_mismatch_warnings == false) {
          local_58._M_dataplus._M_p =
               (pointer)((double)(lVar5 % 1000000000) * 1e-09 + (double)(lVar5 / 1000000000));
          fmt.size_ = 10;
          fmt.data_ = (char *)0x16;
          args.field_1.values_ = (value<fmt::v11::context> *)in_R9;
          args.desc_ = (unsigned_long_long)&local_58;
          ::fmt::v11::vformat_abi_cxx11_(&local_78,(v11 *)"forced Granted Time={}",fmt,args);
          logMessageSource_01._M_str = _Var6._M_p;
          logMessageSource_01._M_len = sVar17;
          message_01._M_str = local_78._M_dataplus._M_p;
          message_01._M_len = local_78._M_string_length;
          logMessage(this,3,logMessageSource_01,message_01,false);
LAB_002ca7f0:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else if (0xe < this->maxLogLevel) {
        local_58._M_dataplus._M_p =
             (pointer)((double)(lVar5 % 1000000000) * 1e-09 + (double)(lVar5 / 1000000000));
        fmt_00.size_ = 10;
        fmt_00.data_ = (char *)0xf;
        args_00.field_1.values_ = (value<fmt::v11::context> *)in_R9;
        args_00.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v11::vformat_abi_cxx11_(&local_78,(v11 *)0x3eda35,fmt_00,args_00);
        logMessageSource_02._M_str = _Var6._M_p;
        logMessageSource_02._M_len = sVar17;
        message_02._M_str = local_78._M_dataplus._M_p;
        message_02._M_len = local_78._M_string_length;
        logMessage(this,0xf,logMessageSource_02,message_02,false);
        goto LAB_002ca7f0;
      }
    }
    MVar9 = (proc_result->
            super__Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool>).
            super__Tuple_impl<1UL,_helics::MessageProcessingResult,_bool>.
            super__Head_base<1UL,_helics::MessageProcessingResult,_false>._M_head_impl;
  }
  uVar10 = (ushort)(byte)MVar9;
  uVar13 = 0x100;
LAB_002ca812:
  return (_Optional_base<helics::MessageProcessingResult,_true,_true>)(uVar13 | uVar10);
}

Assistant:

std::optional<MessageProcessingResult> FederateState::checkProcResult(
    std::tuple<FederateStates, MessageProcessingResult, bool>& proc_result,
    ActionMessage& cmd)
{
    timeGranted_mode = std::get<2>(proc_result);

    if (getState() != std::get<0>(proc_result)) {
        setState(std::get<0>(proc_result));
        switch (std::get<0>(proc_result)) {
            case FederateStates::INITIALIZING:
                LOG_TIMING("Granting Initialization");
                if (checkInterfaces() != defs::Errors::OK) {
                    setState(FederateStates::ERRORED);
                    return MessageProcessingResult::ERROR_RESULT;
                }
                timeCoord->enterInitialization();
                break;
            case FederateStates::EXECUTING:
                timeCoord->updateTimeFactors();
                LOG_TIMING("Granting Execution");
                break;
            case FederateStates::FINISHED:
                LOG_TIMING("Terminating");
                break;
            case FederateStates::ERRORED:
                if (cmd.payload.empty()) {
                    errorString = commandErrorString(cmd.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(cmd.messageID);
                    }
                } else {
                    errorString = cmd.payload.to_string();
                }
                errorCode = cmd.messageID;
                LOG_ERROR(errorString);
                break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (cmd.dest_id != global_id.load()) {
                routeMessage(cmd);
                return MessageProcessingResult::CONTINUE_PROCESSING;
            }
            return processActionMessage(cmd);
        case MessageProcessingResult::DELAY_MESSAGE:
            addFederateToDelay(GlobalFederateId(cmd.source_id));
            return MessageProcessingResult::DELAY_MESSAGE;
        default:
            if (timeGranted_mode) {
                time_granted = timeCoord->getGrantedTime();
                allowed_send_time = timeCoord->allowedSendTime();
                if (cmd.action() == CMD_FORCE_TIME_GRANT) {
                    if (!ignore_time_mismatch_warnings) {
                        LOG_WARNING(fmt::format("forced Granted Time={}",
                                                static_cast<double>(time_granted)));
                    }
                } else {
                    LOG_TIMING(fmt::format("Granted Time={}", static_cast<double>(time_granted)));
                }
            }
            return (std::get<1>(proc_result));
    }
    return std::nullopt;
}